

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O2

void test_accept_no_handler(void)

{
  cio_address_family family;
  cio_error cVar1;
  cio_server_socket ss;
  cio_socket_address endpoint;
  cio_eventloop loop;
  
  alloc_client_fake.custom_fake = alloc_success;
  free_client_fake.custom_fake = free_success;
  fill_inet_socket_address(&endpoint);
  family = cio_socket_address_get_family(&endpoint);
  cVar1 = cio_server_socket_init(&ss,&loop,5,family,alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Initialization of server socket failed!",0x1f0,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_bind(&ss,&endpoint);
  UnityAssertEqualNumber
            (0,(long)cVar1,"call to bind() did not succeed!",499,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_accept(&ss,(cio_accept_handler_t)0x0,(void *)0x0);
  UnityAssertEqualNumber(-0x16,(long)cVar1,(char *)0x0,0x1f6,UNITY_DISPLAY_STYLE_INT);
  cio_server_socket_close(&ss);
  UnityAssertEqualNumber
            (1,(ulong)on_close_fake.call_count,(char *)0x0,0x1f8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&ss,(UNITY_INT)on_close_fake.arg0_val,(char *)0x0,0x1f9,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_accept_no_handler(void)
{
	struct cio_eventloop loop;
	struct cio_server_socket ss;
	alloc_client_fake.custom_fake = alloc_success;
	free_client_fake.custom_fake = free_success;

	struct cio_socket_address endpoint;
	fill_inet_socket_address(&endpoint);

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, cio_socket_address_get_family(&endpoint), alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Initialization of server socket failed!");

	err = cio_server_socket_bind(&ss, &endpoint);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "call to bind() did not succeed!");

	err = cio_server_socket_accept(&ss, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_INVALID_ARGUMENT, err);
	cio_server_socket_close(&ss);
	TEST_ASSERT_EQUAL(1, on_close_fake.call_count);
	TEST_ASSERT_EQUAL(&ss, on_close_fake.arg0_val);
}